

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pokey.c
# Opt level: O0

void device_reset_pokey(void *info)

{
  int local_1c;
  int i;
  pokey_device *d;
  void *info_local;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    *(void **)((long)info + (long)local_1c * 0x18 + 0x10) = info;
    *(undefined1 *)((long)info + (long)local_1c * 0x18 + 0x18) = 0;
    *(undefined1 *)((long)info + (long)local_1c * 0x18 + 0x19) = 0;
    *(undefined1 *)((long)info + (long)local_1c * 0x18 + 0x1a) = 0xb0;
    *(undefined4 *)((long)info + (long)local_1c * 0x18 + 0x1c) = 0;
    *(undefined4 *)((long)info + (long)local_1c * 0x18 + 0x20) = 0;
    *(undefined1 *)((long)info + (long)local_1c * 0x18 + 0x24) = 0;
    *(undefined1 *)((long)info + (long)local_1c * 0x18 + 0x25) = 0;
  }
  *(undefined1 *)((long)info + 0x18) = 1;
  *(undefined1 *)((long)info + 0x30) = 2;
  *(undefined1 *)((long)info + 0x60) = 4;
  *(undefined1 *)((long)info + 0xa6) = 9;
  *(undefined1 *)((long)info + 0xac) = 3;
  *(undefined1 *)((long)info + 0xab) = 0;
  *(undefined1 *)((long)info + 0xa9) = 8;
  *(undefined1 *)((long)info + 0xaa) = 0;
  *(undefined1 *)((long)info + 0xa4) = 0;
  *(undefined4 *)((long)info + 0x8c) = 0;
  *(undefined4 *)((long)info + 0x90) = 0;
  *(undefined4 *)((long)info + 0x94) = 0;
  *(undefined4 *)((long)info + 0x98) = 0;
  *(undefined1 *)((long)info + 0xa5) = 0;
  *(undefined1 *)((long)info + 0xad) = 0;
  *(undefined1 *)((long)info + 0xae) = 0;
  *(undefined8 *)((long)info + 0x78) = 0;
  *(undefined4 *)((long)info + 0x70) = 0;
  *(undefined1 *)((long)info + 0x74) = 1;
  *(undefined1 *)((long)info + 0xb0) = 0;
  *(undefined4 *)((long)info + 0x100990) = 0;
  memset((void *)((long)info + 0x80),0,0xc);
  memset((void *)((long)info + 0x9c),0,8);
  pokey_potgo((pokey_device *)info);
  return;
}

Assistant:

static void device_reset_pokey(void *info)
{
	pokey_device *d = (pokey_device *)info;
	int i;

	// Set up channels
	for (i=0; i<POKEY_CHANNELS; i++)
	{
		d->m_channel[i].m_parent = d;
		d->m_channel[i].m_INTMask = 0;
		d->m_channel[i].m_AUDF = 0;
		d->m_channel[i].m_AUDC = 0xb0;
		d->m_channel[i].m_borrow_cnt = 0;
		d->m_channel[i].m_counter = 0;
		d->m_channel[i].m_output = 0;
		d->m_channel[i].m_filter_sample = 0;
	}
	d->m_channel[CHAN1].m_INTMask = IRQ_TIMR1;
	d->m_channel[CHAN2].m_INTMask = IRQ_TIMR2;
	d->m_channel[CHAN4].m_INTMask = IRQ_TIMR4;

	/* The pokey does not have a reset line. These should be initialized
	 * with random values.
	 */

	d->m_KBCODE = 0x09;		 // Atari 800 'no key'
	//d->m_SKCTL = 0;

	// TODO: several a7800 demos don't explicitly reset pokey at startup
	// See https://atariage.com/forums/topic/337317-a7800-52-release/ and
	// https://atariage.com/forums/topic/268458-a7800-the-atari-7800-emulator/?do=findComment&comment=5079170)
	d->m_SKCTL = SK_RESET;	// NOTE: Some VGMs rely on this being initialized with SK_RESET.

	d->m_SKSTAT = 0;
	/* This bit should probably get set later. Acid5200 pokey_setoc test tests this. */
	d->m_IRQST = IRQ_SEROC;
	d->m_IRQEN = 0;
	d->m_AUDCTL = 0;
	d->m_p4 = 0;
	d->m_p5 = 0;
	d->m_p9 = 0;
	d->m_p17 = 0;
	d->m_ALLPOT = 0x00;

	d->m_pot_counter = 0;
	d->m_kbd_cnt = 0;
	d->m_out_filter = 0;
	d->m_out_raw = 0;
	d->m_old_raw_inval = 1;
	d->m_kbd_state = 0;

	d->m_icount = 0;

	/* reset more internal state */
	memset(d->m_clock_cnt, 0, sizeof(d->m_clock_cnt));
	memset(d->m_POTx, 0, sizeof(d->m_POTx));

	// a1200xl reads POT4 twice at startup for reading self-test mode jumpers.
	// we need to update POT counters here otherwise it will boot to self-test
	// the first time around no matter the setting.
	pokey_potgo(d);
}